

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreVarLenUint8(size_t n,size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  size_t nbits;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t n_local;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  if (n == 0) {
    *(ulong *)(storage + (*storage_ix >> 3)) =
         0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 1;
  }
  else {
    uVar1 = 0x1f;
    if ((uint)n != 0) {
      for (; (uint)n >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 1;
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)uVar1 << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 3;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         n - (1L << ((byte)uVar1 & 0x3f)) << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)uVar1 + *storage_ix;
  }
  return;
}

Assistant:

static void StoreVarLenUint8(size_t n, size_t* storage_ix, uint8_t* storage) {
  if (n == 0) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  } else {
    size_t nbits = Log2FloorNonZero(n);
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(3, nbits, storage_ix, storage);
    BrotliWriteBits(nbits, n - ((size_t)1 << nbits), storage_ix, storage);
  }
}